

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O2

bool __thiscall chatra::Thread::callOperator(Thread *this)

{
  pointer *pppVar1;
  pointer pFVar2;
  pointer ppVar3;
  Node *pNVar4;
  Tuple *tuple;
  TemporaryObject *this_00;
  EvaluateValueResult EVar5;
  unsigned_long uVar6;
  _Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> local_58;
  Node *local_40;
  int local_34;
  
  pFVar2 = (this->frames).super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>._M_impl.
           super__Vector_impl_data._M_finish;
  ppVar3 = pFVar2[-1].stack.
           super__Vector_base<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pNVar4 = ppVar3[-1].first;
  if (3 < ppVar3[-1].second) {
LAB_00155759:
    tuple = (Tuple *)((pFVar2[-1].values.
                       super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-2]->targetRef).node)->object;
    checkTupleAsArgOrThrow
              (this,(pNVar4->subNodes).
                    super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].
                    super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr,tuple);
    this_00 = pFVar2[-1].values.
              super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1];
    pNVar4 = (pNVar4->subNodes).
             super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    Tuple::toArgs((vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> *)&local_58,
                  tuple);
    TemporaryObject::addArgument
              (this_00,pNVar4,
               (vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> *)&local_58);
    std::_Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>::~_Vector_base
              (&local_58);
    pppVar1 = &pFVar2[-1].stack.
               super__Vector_base<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pppVar1 = *pppVar1 + -1;
    return true;
  }
  switch(ppVar3[-1].second) {
  case 0:
    ppVar3[-1].second = 1;
    local_40 = (pNVar4->subNodes).
               super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].
               super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    goto LAB_0015573c;
  case 1:
    EVar5 = evaluateValue(this,Value);
    if (EVar5 == Suspend) {
      return false;
    }
    if (EVar5 == StackChanged) {
      return true;
    }
    uVar6 = ppVar3[-1].second + 1;
    break;
  case 2:
    uVar6 = 3;
    break;
  case 3:
    if (pFVar2[-1].values.
        super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>.
        _M_impl.super__Vector_impl_data._M_finish[-1]->hasArgs == false) {
      ppVar3[-1].second = 4;
    }
    else {
      EVar5 = evaluateValue(this,Value);
      if (EVar5 == Suspend) {
        return false;
      }
      if (EVar5 == StackChanged) {
        return true;
      }
    }
    goto LAB_00155759;
  }
  ppVar3[-1].second = uVar6;
  local_40 = (((pNVar4->subNodes).
               super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
LAB_0015573c:
  local_34 = 0;
  std::
  vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
  ::emplace_back<chatra::Node*,int>
            ((vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
              *)&pFVar2[-1].stack,&local_40,&local_34);
  return true;
}

Assistant:

bool Thread::callOperator() {
	auto& f = frames.back();
	auto* node = f.stack.back().first;
	auto& nodePhase = f.stack.back().second;

	switch (nodePhase) {
	case 0:  nodePhase++;  f.stack.emplace_back(node->subNodes[1].get(), 0);  return true;
	case 1:  CHATRA_EVALUATE_VALUE;
	case 2:  nodePhase++;  f.stack.emplace_back(node->subNodes[0].get(), 0);  return true;
	case 3:
		// To evaluate the case of "foo(...)(...)" which "foo(...)" returns an object
		if (!f.values.back()->hasArguments())
			nodePhase++;
		else
			CHATRA_EVALUATE_VALUE;
	default: {
		auto& tuple = (*(f.values.end() - 2))->getRef().deref<Tuple>();
		checkTupleAsArgOrThrow(node->subNodes[1].get(), tuple);
		f.values.back()->addArgument(node->subNodes[1].get(), tuple.toArgs());
		f.stack.pop_back();
		return true;
	}
	}
}